

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_fma::forward(Padding_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int *piVar2;
  void *pvVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined8 uVar13;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  int iVar20;
  ulong uVar21;
  sbyte sVar22;
  _func_int **pp_Var23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [16];
  int iVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  _func_int *p_Var36;
  int x_1;
  int iVar37;
  int iVar38;
  int x_2;
  ulong uVar39;
  int x;
  undefined1 (*pauVar40) [32];
  undefined1 (*pauVar41) [16];
  uint uVar42;
  undefined1 (*pauVar43) [32];
  undefined1 (*pauVar44) [16];
  long lVar45;
  long lVar46;
  int z;
  long lVar47;
  ulong uVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar54;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined8 in_XMM1_Qa;
  __m128 v_03;
  __m128 v_04;
  __m128 v_05;
  __m128 v_06;
  Padding_x86_fma *pPVar55;
  Padding_x86_fma *pPVar56;
  Mat *pMVar57;
  float fVar58;
  undefined4 uVar59;
  Mat m_1;
  Mat m;
  undefined8 local_58;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  
  p_Var36 = this->_vptr_Padding_x86_fma[-3];
  uVar24 = *(uint *)(&this->field_0xd0 + (long)p_Var36);
  if (((((uVar24 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var36) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var36) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var36) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var36) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var36) == 0)) {
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar20 = bottom_blob->w;
      iVar54 = bottom_blob->h;
      iVar37 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar20;
      top_blob->h = iVar54;
      top_blob->d = iVar37;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  m.elempack = bottom_blob->elempack;
  m.elemsize = bottom_blob->elemsize;
  if (m.elempack == 0) {
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    iVar20 = bottom_blob->d;
    iVar54 = bottom_blob->c;
    m.dims = bottom_blob->dims;
  }
  else {
    if (((int)m.elemsize * 8) / m.elempack == 8) {
      iVar20 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar20;
    }
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    iVar20 = bottom_blob->d;
    iVar54 = bottom_blob->c;
    m.dims = bottom_blob->dims;
    fVar58 = 0.0;
    if (m.elempack == 4) {
      switch(m.dims) {
      case 1:
        uVar24 = *(uint *)(&this->field_0xd8 + (long)p_Var36) + m.w * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var36);
        sVar22 = 3;
        if ((uVar24 & 7) != 0) {
          sVar22 = ((uVar24 & 3) == 0) * '\x02';
        }
        m.dims = 1;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var36) & 3) == 0) && ((uVar24 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0)) {
          pMVar57 = top_blob;
          Mat::create(top_blob,(int)uVar24 >> 2,(m.elemsize >> 2) << sVar22,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar57->c * pMVar57->cstep != 0) {
            p_Var36 = this->_vptr_Padding_x86_fma[-3];
            v_03[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
            v_03[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
            v_03[2] = (float)(int)in_XMM1_Qa;
            v_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      (bottom_blob,pMVar57,0,0,*(int *)(&this->field_0xd8 + (long)p_Var36) / 4,
                       *(int *)(&this->field_0xdc + (long)p_Var36) / 4,v_03);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar42 = uVar24 + m.h * 4 + *(int *)(&this->field_0xd4 + (long)p_Var36);
        sVar22 = 3;
        if ((uVar42 & 7) != 0) {
          sVar22 = ((uVar42 & 3) == 0) * '\x02';
        }
        m.dims = 2;
        if ((((uVar24 & 3) == 0) && ((uVar42 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0)) {
          pMVar57 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var36) +
                               *(int *)(&this->field_0xdc + (long)p_Var36),(int)uVar42 >> 2,
                      (m.elemsize >> 2) << sVar22,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar57->c * pMVar57->cstep != 0) {
            p_Var36 = this->_vptr_Padding_x86_fma[-3];
            v_06[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
            v_06[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
            v_06[2] = (float)(int)in_XMM1_Qa;
            v_06[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      (bottom_blob,pMVar57,*(int *)(&this->field_0xd0 + (long)p_Var36) / 4,
                       *(int *)(&this->field_0xd4 + (long)p_Var36) / 4,
                       *(int *)(&this->field_0xd8 + (long)p_Var36),
                       *(int *)(&this->field_0xdc + (long)p_Var36),v_06);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar42 = *(uint *)(&this->field_0xe8 + (long)p_Var36) + iVar54 * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var36);
        sVar22 = ((uVar42 & 3) == 0) * '\x02';
        m.dims = 3;
        if ((uVar42 & 7) == 0) {
          sVar22 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var36) & 3) == 0) && ((uVar42 & 7) == 4)) {
          if ((uVar42 == iVar54 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0)) {
            uVar42 = (int)uVar42 >> 2;
            pMVar57 = top_blob;
            Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var36) +
                                 *(int *)(&this->field_0xdc + (long)p_Var36),
                        uVar24 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var36),uVar42,
                        (m.elemsize >> 2) << sVar22,4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar57->c * pMVar57->cstep != 0) {
              uVar48 = (long)*(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_fma[-3]) /
                       -4;
              if ((int)uVar42 < 1) {
                uVar42 = 0;
              }
              uVar39 = uVar48 & 0xffffffff;
              pPVar55 = this;
              for (uVar21 = 0; uVar21 != uVar42; uVar21 = uVar21 + 1) {
                m.w = pMVar57->w;
                m.h = pMVar57->h;
                m.elemsize = pMVar57->elemsize;
                pauVar44 = (undefined1 (*) [16])
                           (pMVar57->cstep * uVar21 * m.elemsize + (long)pMVar57->data);
                m.elempack = pMVar57->elempack;
                m.allocator = pMVar57->allocator;
                m.refcount = (int *)0x0;
                m.c = pMVar57->d;
                m.d = 1;
                m.dims = pMVar57->dims + -1;
                m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                          m.elemsize;
                if (pMVar57->dims == 4) {
                  m.cstep = (long)m.h * (long)m.w;
                }
                pp_Var23 = this->_vptr_Padding_x86_fma;
                p_Var36 = pp_Var23[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var36) == 0) {
                  uVar59 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
                  auVar50._4_4_ = uVar59;
                  auVar50._0_4_ = uVar59;
                  auVar50._8_4_ = uVar59;
                  auVar50._12_4_ = uVar59;
                }
                else {
                  auVar50 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var36) + uVar21 * 0x10);
                }
                uVar24 = (int)uVar48 + (int)uVar21;
                if ((int)uVar24 < 0 || iVar54 <= (int)uVar24) {
                  iVar20 = pMVar57->d * (int)m.cstep;
                  if (iVar20 < 1) {
                    iVar20 = 0;
                  }
                  while (iVar20 != 0) {
                    *pauVar44 = auVar50;
                    pauVar44 = pauVar44 + 1;
                    iVar20 = iVar20 + -1;
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.c = bottom_blob->d;
                  pvVar3 = bottom_blob->data;
                  uVar27 = bottom_blob->elemsize;
                  sVar4 = bottom_blob->cstep;
                  pauVar30 = (undefined1 (*) [16])(uVar24 * sVar4 * uVar27 + (long)pvVar3);
                  m_1.allocator = bottom_blob->allocator;
                  m_1.refcount = (int *)0x0;
                  m_1.elempack = bottom_blob->elempack;
                  m_1.d = 1;
                  m_1.dims = bottom_blob->dims + -1;
                  m_1.cstep = (uVar27 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                              uVar27;
                  if (bottom_blob->dims == 4) {
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                  }
                  iVar20 = *(int *)(&pPVar55->field_0xe0 + (long)p_Var36);
                  this = pPVar55;
                  m_1.data = pauVar30;
                  m_1.elemsize = uVar27;
                  m.data = pauVar44;
                  if (iVar20 == 0) {
                    v_04._0_8_ = auVar50._0_8_;
                    v_04[2] = (float)(int)in_XMM1_Qa;
                    v_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    padding_constant_pack4_sse
                              (&m_1,&m,*(int *)(&pPVar55->field_0xd0 + (long)p_Var36),
                               *(int *)(&pPVar55->field_0xd4 + (long)p_Var36),
                               *(int *)(&pPVar55->field_0xd8 + (long)p_Var36),
                               *(int *)(&pPVar55->field_0xdc + (long)p_Var36),v_04);
                    pp_Var23 = pPVar55->_vptr_Padding_x86_fma;
                    p_Var36 = pp_Var23[-3];
                    iVar20 = *(int *)(&pPVar55->field_0xe0 + (long)p_Var36);
                  }
                  if (iVar20 == 1) {
                    iVar37 = 0;
                    iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var36);
                    if (*(int *)(&this->field_0xd8 + (long)p_Var36) < 1) {
                      iVar20 = 0;
                    }
                    iVar28 = *(int *)(&this->field_0xdc + (long)p_Var36);
                    if (*(int *)(&this->field_0xdc + (long)p_Var36) < 1) {
                      iVar28 = 0;
                    }
                    iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var36);
                    if (*(int *)(&this->field_0xd0 + (long)p_Var36) < 1) {
                      iVar38 = iVar37;
                    }
                    iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var36);
                    for (; iVar37 != iVar38; iVar37 = iVar37 + 1) {
                      auVar51 = *pauVar30;
                      iVar35 = iVar20;
                      while (bVar49 = iVar35 != 0, iVar35 = iVar35 + -1, bVar49) {
                        *pauVar44 = auVar51;
                        pauVar44 = pauVar44 + 1;
                      }
                      lVar46 = 0;
                      for (iVar35 = 0; iVar35 < m_1.w; iVar35 = iVar35 + 1) {
                        auVar51 = *(undefined1 (*) [16])
                                   ((long)pvVar3 + lVar46 + sVar4 * uVar27 * uVar39);
                        *(undefined1 (*) [16])(*pauVar44 + lVar46) = auVar51;
                        lVar46 = lVar46 + 0x10;
                      }
                      pauVar44 = (undefined1 (*) [16])(*pauVar44 + lVar46);
                      iVar35 = iVar28;
                      while (bVar49 = iVar35 != 0, iVar35 = iVar35 + -1, bVar49) {
                        *pauVar44 = auVar51;
                        pauVar44 = pauVar44 + 1;
                      }
                    }
                    for (iVar37 = 0; iVar37 < m_1.h; iVar37 = iVar37 + 1) {
                      auVar51 = *pauVar30;
                      iVar38 = iVar20;
                      while (bVar49 = iVar38 != 0, iVar38 = iVar38 + -1, bVar49) {
                        *pauVar44 = auVar51;
                        pauVar44 = pauVar44 + 1;
                      }
                      for (iVar38 = 0; iVar35 = iVar28, iVar38 < m_1.w; iVar38 = iVar38 + 1) {
                        auVar51 = *pauVar30;
                        *pauVar44 = auVar51;
                        pauVar30 = pauVar30 + 1;
                        pauVar44 = pauVar44 + 1;
                      }
                      while (iVar35 != 0) {
                        *pauVar44 = auVar51;
                        pauVar44 = pauVar44 + 1;
                        iVar35 = iVar35 + -1;
                      }
                    }
                    pauVar30 = (undefined1 (*) [16])((long)pauVar30 + (long)(m_1.w << 2) * -4);
                    iVar37 = 0;
                    if (iVar31 < 1) {
                      iVar31 = iVar37;
                    }
                    for (; iVar37 != iVar31; iVar37 = iVar37 + 1) {
                      auVar51 = *pauVar30;
                      iVar38 = iVar20;
                      while (bVar49 = iVar38 != 0, iVar38 = iVar38 + -1, bVar49) {
                        *pauVar44 = auVar51;
                        pauVar44 = pauVar44 + 1;
                      }
                      lVar46 = 0;
                      for (iVar38 = 0; iVar38 < m_1.w; iVar38 = iVar38 + 1) {
                        auVar51 = *(undefined1 (*) [16])(*pauVar30 + lVar46);
                        *(undefined1 (*) [16])(*pauVar44 + lVar46) = auVar51;
                        lVar46 = lVar46 + 0x10;
                      }
                      pauVar44 = (undefined1 (*) [16])(*pauVar44 + lVar46);
                      iVar38 = iVar28;
                      while (bVar49 = iVar38 != 0, iVar38 = iVar38 + -1, bVar49) {
                        *pauVar44 = auVar51;
                        pauVar44 = pauVar44 + 1;
                      }
                    }
                    p_Var36 = pp_Var23[-3];
                    iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var36);
                  }
                  lVar46 = -0x20;
                  if (iVar20 == 2) {
                    iVar20 = *(int *)(&this->field_0xd0 + (long)p_Var36);
                    uVar24 = *(uint *)(&this->field_0xd8 + (long)p_Var36);
                    pauVar44 = (undefined1 (*) [16])
                               ((long)(m_1.w * iVar20 * 4) * 4 + (long)m_1.data);
                    uVar25 = 0;
                    uVar27 = 0;
                    if (0 < (int)uVar24) {
                      uVar27 = (ulong)uVar24;
                    }
                    uVar34 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var36);
                    if ((int)*(uint *)(&this->field_0xdc + (long)p_Var36) < 1) {
                      uVar34 = uVar25;
                    }
                    iVar37 = *(int *)(&this->field_0xd4 + (long)p_Var36);
                    if (iVar20 < 1) {
                      iVar20 = 0;
                    }
                    lVar26 = uVar27 * 0x10;
                    lVar33 = uVar34 * 0x10;
                    pauVar30 = (undefined1 (*) [16])m.data;
                    for (; (int)uVar25 != iVar20; uVar25 = (ulong)((int)uVar25 + 1)) {
                      lVar47 = 0;
                      for (lVar45 = 0; lVar26 + lVar45 != 0; lVar45 = lVar45 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar30 + lVar47) =
                             *(undefined1 (*) [16])(pauVar44[(int)uVar24] + lVar45);
                        lVar47 = lVar47 + 0x10;
                      }
                      pauVar30 = (undefined1 (*) [16])((long)pauVar30 - lVar45);
                      pauVar41 = pauVar44;
                      for (iVar28 = 0; lVar45 = lVar46, iVar28 < m_1.w; iVar28 = iVar28 + 1) {
                        *pauVar30 = *pauVar41;
                        pauVar41 = pauVar41 + 1;
                        pauVar30 = pauVar30 + 1;
                      }
                      for (; lVar33 + lVar45 != -0x20; lVar45 = lVar45 + -0x10) {
                        *pauVar30 = *(undefined1 (*) [16])(*pauVar41 + lVar45);
                        pauVar30 = pauVar30 + 1;
                      }
                      pauVar44 = pauVar44 + -(long)m_1.w;
                    }
                    for (iVar20 = 0; iVar20 < m_1.h; iVar20 = iVar20 + 1) {
                      lVar47 = 0;
                      for (lVar45 = 0; lVar26 + lVar45 != 0; lVar45 = lVar45 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar30 + lVar47) =
                             *(undefined1 (*) [16])(pauVar44[(int)uVar24] + lVar45);
                        lVar47 = lVar47 + 0x10;
                      }
                      pauVar30 = (undefined1 (*) [16])((long)pauVar30 - lVar45);
                      for (iVar28 = 0; lVar45 = lVar46, iVar28 < m_1.w; iVar28 = iVar28 + 1) {
                        *pauVar30 = *pauVar44;
                        pauVar44 = pauVar44 + 1;
                        pauVar30 = pauVar30 + 1;
                      }
                      for (; lVar33 + lVar45 != -0x20; lVar45 = lVar45 + -0x10) {
                        *pauVar30 = *(undefined1 (*) [16])(*pauVar44 + lVar45);
                        pauVar30 = pauVar30 + 1;
                      }
                    }
                    pauVar44 = pauVar44 + (long)m_1.w * -2;
                    iVar20 = 0;
                    if (iVar37 < 1) {
                      iVar37 = iVar20;
                    }
                    for (; iVar20 != iVar37; iVar20 = iVar20 + 1) {
                      lVar47 = 0;
                      for (lVar45 = 0; lVar26 + lVar45 != 0; lVar45 = lVar45 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar30 + lVar47) =
                             *(undefined1 (*) [16])(pauVar44[(int)uVar24] + lVar45);
                        lVar47 = lVar47 + 0x10;
                      }
                      pauVar30 = (undefined1 (*) [16])((long)pauVar30 - lVar45);
                      pauVar41 = pauVar44;
                      for (iVar28 = 0; lVar45 = lVar46, iVar28 < m_1.w; iVar28 = iVar28 + 1) {
                        *pauVar30 = *pauVar41;
                        pauVar41 = pauVar41 + 1;
                        pauVar30 = pauVar30 + 1;
                      }
                      for (; lVar33 + lVar45 != -0x20; lVar45 = lVar45 + -0x10) {
                        *pauVar30 = *(undefined1 (*) [16])(*pauVar41 + lVar45);
                        pauVar30 = pauVar30 + 1;
                      }
                      pauVar44 = pauVar44 + -(long)m_1.w;
                    }
                  }
                  pPVar55 = this;
                  if (m_1.refcount != (int *)0x0) {
                    LOCK();
                    *m_1.refcount = *m_1.refcount + -1;
                    UNLOCK();
                    if (*m_1.refcount == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (m.refcount != (int *)0x0) {
                    LOCK();
                    *m.refcount = *m.refcount + -1;
                    UNLOCK();
                    if (*m.refcount == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        free(m.data);
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar39 = (ulong)((int)uVar39 + 1);
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        m.dims = 4;
        if (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0) {
          uVar42 = *(int *)(&this->field_0xe8 + (long)p_Var36) + iVar20 +
                   *(int *)(&this->field_0xec + (long)p_Var36);
          pMVar57 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var36) +
                               *(int *)(&this->field_0xdc + (long)p_Var36),
                      uVar24 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var36),uVar42,iVar54,
                      m.elemsize,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar57->c * pMVar57->cstep != 0) {
            if ((int)uVar42 < 1) {
              uVar42 = 0;
            }
            if (iVar54 < 1) {
              iVar54 = 0;
            }
            uVar59 = 0;
            pPVar55 = this;
            for (lVar46 = 0; lVar46 != CONCAT44(uVar59,iVar54); lVar46 = lVar46 + 1) {
              p_Var36 = this->_vptr_Padding_x86_fma[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var36) == 0) {
                uVar1 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
                auVar51._4_4_ = uVar1;
                auVar51._0_4_ = uVar1;
                auVar51._8_4_ = uVar1;
                auVar51._12_4_ = uVar1;
              }
              else {
                auVar51 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0xf8 + (long)p_Var36) + lVar46 * 0x10);
              }
              for (uVar48 = 0; uVar48 != uVar42; uVar48 = uVar48 + 1) {
                m.w = pMVar57->w;
                m.h = pMVar57->h;
                m.elemsize = pMVar57->elemsize;
                m.elempack = pMVar57->elempack;
                m.allocator = pMVar57->allocator;
                m.cstep = (long)m.h * (long)m.w;
                m.data = (void *)((long)pMVar57->data +
                                 uVar48 * m.elemsize * m.cstep +
                                 pMVar57->cstep * lVar46 * m.elemsize);
                m.refcount = (int *)0x0;
                m.dims = 2;
                m.d = 1;
                m.c = 1;
                p_Var36 = this->_vptr_Padding_x86_fma[-3];
                uVar24 = (int)uVar48 - *(int *)(&this->field_0xe8 + (long)p_Var36);
                if ((int)uVar24 < 0 || iVar20 <= (int)uVar24) {
                  uVar21 = m.cstep & 0xffffffff;
                  if ((int)m.cstep < 1) {
                    uVar21 = 0;
                  }
                  while (iVar37 = (int)uVar21, uVar21 = (ulong)(iVar37 - 1), iVar37 != 0) {
                    *(undefined1 (*) [16])m.data = auVar51;
                    m.data = (void *)((long)m.data + 0x10);
                  }
                }
                else {
                  m_1.h = bottom_blob->h;
                  m_1.elemsize = bottom_blob->elemsize;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                  m_1.data = (void *)((long)bottom_blob->data +
                                     m_1.cstep * m_1.elemsize * (ulong)uVar24 +
                                     bottom_blob->cstep * lVar46 * m_1.elemsize);
                  m_1.refcount = (int *)0x0;
                  m_1.elempack = bottom_blob->elempack;
                  m_1.w = bottom_blob->w;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  local_58 = auVar51._0_8_;
                  v_05[2] = (float)(int)in_XMM1_Qa;
                  v_05[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                  v_05[0] = (float)(undefined4)local_58;
                  v_05[1] = (float)local_58._4_4_;
                  pPVar56 = pPVar55;
                  padding_constant_pack4_sse
                            (&m_1,&m,*(int *)(&pPVar55->field_0xd0 + (long)p_Var36),
                             *(int *)(&pPVar55->field_0xd4 + (long)p_Var36),
                             *(int *)(&pPVar55->field_0xd8 + (long)p_Var36),
                             *(int *)(&pPVar55->field_0xdc + (long)p_Var36),v_05);
                  this = pPVar55;
                  pPVar55 = pPVar56;
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (m.elempack == 8) {
      switch(m.dims) {
      case 1:
        uVar24 = *(uint *)(&this->field_0xd8 + (long)p_Var36) + m.w * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var36);
        sVar22 = 3;
        if ((uVar24 & 7) != 0) {
          sVar22 = ((uVar24 & 3) == 0) * '\x02';
        }
        m.dims = 1;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var36) | uVar24) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0)) {
          pMVar57 = top_blob;
          Mat::create(top_blob,(int)uVar24 / 8,(m.elemsize >> 3) << sVar22,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar57->c * pMVar57->cstep != 0) {
            v._8_8_ = pMVar57;
            v._0_8_ = this;
            v._16_8_ = bottom_blob;
            v[6] = (float)iVar54;
            v[7] = fVar58;
            padding_constant_pack8_avx
                      (bottom_blob,pMVar57,0,0,
                       *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_fma[-3]) / 8,
                       *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_fma[-3]) / 8,v);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar42 = uVar24 + m.h * 8 + *(int *)(&this->field_0xd4 + (long)p_Var36);
        sVar22 = 3;
        if ((uVar42 & 7) != 0) {
          sVar22 = ((uVar42 & 3) == 0) * '\x02';
        }
        m.dims = 2;
        if ((((uVar24 | uVar42) & 7) == 0) && (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0)) {
          pMVar57 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var36) +
                               *(int *)(&this->field_0xdc + (long)p_Var36),(int)uVar42 / 8,
                      (m.elemsize >> 3) << sVar22,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar57->c * pMVar57->cstep != 0) {
            p_Var36 = this->_vptr_Padding_x86_fma[-3];
            v_02._8_8_ = pMVar57;
            v_02._0_8_ = this;
            v_02._16_8_ = bottom_blob;
            v_02[6] = (float)iVar54;
            v_02[7] = fVar58;
            padding_constant_pack8_avx
                      (bottom_blob,pMVar57,*(int *)(&this->field_0xd0 + (long)p_Var36) / 8,
                       *(int *)(&this->field_0xd4 + (long)p_Var36) / 8,
                       *(int *)(&this->field_0xd8 + (long)p_Var36),
                       *(int *)(&this->field_0xdc + (long)p_Var36),v_02);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar42 = *(uint *)(&this->field_0xe8 + (long)p_Var36) + iVar54 * 8 +
                 *(int *)(&this->field_0xec + (long)p_Var36);
        sVar22 = ((uVar42 & 3) == 0) * '\x02';
        m.dims = 3;
        if ((uVar42 & 7) == 0) {
          sVar22 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var36) | uVar42) & 7) == 0) {
          if ((uVar42 == iVar54 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0)) {
            uVar48 = (long)(int)uVar42 / 8 & 0xffffffff;
            iVar20 = (int)((long)(int)uVar42 / 8);
            pMVar57 = top_blob;
            Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var36) +
                                 *(int *)(&this->field_0xdc + (long)p_Var36),
                        uVar24 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var36),iVar20,
                        (m.elemsize >> 3) << sVar22,8,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar57->c * pMVar57->cstep != 0) {
              uVar21 = (long)*(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_fma[-3]) /
                       -8;
              if (iVar20 < 1) {
                uVar48 = 0;
              }
              uVar27 = uVar21 & 0xffffffff;
              pPVar55 = this;
              for (uVar39 = 0; uVar39 != uVar48; uVar39 = uVar39 + 1) {
                m.w = pMVar57->w;
                m.h = pMVar57->h;
                m.elemsize = pMVar57->elemsize;
                pauVar43 = (undefined1 (*) [32])
                           (pMVar57->cstep * uVar39 * m.elemsize + (long)pMVar57->data);
                m.elempack = pMVar57->elempack;
                m.allocator = pMVar57->allocator;
                m.refcount = (int *)0x0;
                m.c = pMVar57->d;
                m.d = 1;
                m.dims = pMVar57->dims + -1;
                m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                          m.elemsize;
                if (pMVar57->dims == 4) {
                  m.cstep = (long)m.h * (long)m.w;
                }
                pp_Var23 = this->_vptr_Padding_x86_fma;
                p_Var36 = pp_Var23[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var36) == 0) {
                  uVar59 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
                  auVar52._4_4_ = uVar59;
                  auVar52._0_4_ = uVar59;
                  auVar52._8_4_ = uVar59;
                  auVar52._12_4_ = uVar59;
                  auVar52._16_4_ = uVar59;
                  auVar52._20_4_ = uVar59;
                  auVar52._24_4_ = uVar59;
                  auVar52._28_4_ = uVar59;
                }
                else {
                  auVar52 = *(undefined1 (*) [32])
                             (*(long *)(&this->field_0xf8 + (long)p_Var36) + uVar39 * 0x20);
                }
                uVar24 = (int)uVar21 + (int)uVar39;
                if ((int)uVar24 < 0 || iVar54 <= (int)uVar24) {
                  iVar20 = pMVar57->d * (int)m.cstep;
                  if (iVar20 < 1) {
                    iVar20 = 0;
                  }
                  while (iVar20 != 0) {
                    *pauVar43 = auVar52;
                    pauVar43 = pauVar43 + 1;
                    iVar20 = iVar20 + -1;
                  }
                }
                else {
                  m_1.w = bottom_blob->w;
                  m_1.h = bottom_blob->h;
                  m_1.c = bottom_blob->d;
                  pvVar3 = bottom_blob->data;
                  uVar25 = bottom_blob->elemsize;
                  sVar4 = bottom_blob->cstep;
                  pauVar29 = (undefined1 (*) [32])(uVar24 * sVar4 * uVar25 + (long)pvVar3);
                  m_1.allocator = bottom_blob->allocator;
                  m_1.refcount = (int *)0x0;
                  m_1.elempack = bottom_blob->elempack;
                  m_1.d = 1;
                  m_1.dims = bottom_blob->dims + -1;
                  m_1.cstep = (uVar25 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                              uVar25;
                  if (bottom_blob->dims == 4) {
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                  }
                  iVar20 = *(int *)(&pPVar55->field_0xe0 + (long)p_Var36);
                  this = pPVar55;
                  m_1.data = pauVar29;
                  m_1.elemsize = uVar25;
                  m.data = pauVar43;
                  if (iVar20 == 0) {
                    v_00._8_8_ = pMVar57;
                    v_00._0_8_ = pPVar55;
                    v_00._16_8_ = bottom_blob;
                    v_00[6] = (float)iVar54;
                    v_00[7] = fVar58;
                    padding_constant_pack8_avx
                              (&m_1,&m,*(int *)(&pPVar55->field_0xd0 + (long)p_Var36),
                               *(int *)(&pPVar55->field_0xd4 + (long)p_Var36),
                               *(int *)(&pPVar55->field_0xd8 + (long)p_Var36),
                               *(int *)(&pPVar55->field_0xdc + (long)p_Var36),v_00);
                    pp_Var23 = pPVar55->_vptr_Padding_x86_fma;
                    p_Var36 = pp_Var23[-3];
                    iVar20 = *(int *)(&pPVar55->field_0xe0 + (long)p_Var36);
                  }
                  if (iVar20 == 1) {
                    iVar37 = 0;
                    iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var36);
                    if (*(int *)(&this->field_0xd8 + (long)p_Var36) < 1) {
                      iVar20 = 0;
                    }
                    iVar28 = *(int *)(&this->field_0xdc + (long)p_Var36);
                    if (*(int *)(&this->field_0xdc + (long)p_Var36) < 1) {
                      iVar28 = 0;
                    }
                    iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var36);
                    if (*(int *)(&this->field_0xd0 + (long)p_Var36) < 1) {
                      iVar38 = iVar37;
                    }
                    iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var36);
                    for (; iVar37 != iVar38; iVar37 = iVar37 + 1) {
                      auVar53 = *pauVar29;
                      iVar35 = iVar20;
                      while (bVar49 = iVar35 != 0, iVar35 = iVar35 + -1, bVar49) {
                        *pauVar43 = auVar53;
                        pauVar43 = pauVar43 + 1;
                      }
                      lVar46 = 0;
                      for (iVar35 = 0; iVar35 < m_1.w; iVar35 = iVar35 + 1) {
                        auVar53 = *(undefined1 (*) [32])
                                   ((long)pvVar3 + lVar46 + sVar4 * uVar25 * uVar27);
                        *(undefined1 (*) [32])(*pauVar43 + lVar46) = auVar53;
                        lVar46 = lVar46 + 0x20;
                      }
                      pauVar43 = (undefined1 (*) [32])(*pauVar43 + lVar46);
                      iVar35 = iVar28;
                      while (bVar49 = iVar35 != 0, iVar35 = iVar35 + -1, bVar49) {
                        *pauVar43 = auVar53;
                        pauVar43 = pauVar43 + 1;
                      }
                    }
                    for (iVar37 = 0; iVar37 < m_1.h; iVar37 = iVar37 + 1) {
                      auVar53 = *pauVar29;
                      iVar38 = iVar20;
                      while (bVar49 = iVar38 != 0, iVar38 = iVar38 + -1, bVar49) {
                        *pauVar43 = auVar53;
                        pauVar43 = pauVar43 + 1;
                      }
                      for (iVar38 = 0; iVar35 = iVar28, iVar38 < m_1.w; iVar38 = iVar38 + 1) {
                        auVar53 = *pauVar29;
                        *pauVar43 = auVar53;
                        pauVar29 = pauVar29 + 1;
                        pauVar43 = pauVar43 + 1;
                      }
                      while (iVar35 != 0) {
                        *pauVar43 = auVar53;
                        pauVar43 = pauVar43 + 1;
                        iVar35 = iVar35 + -1;
                      }
                    }
                    pauVar29 = (undefined1 (*) [32])((long)pauVar29 + (long)(m_1.w << 3) * -4);
                    iVar37 = 0;
                    if (iVar31 < 1) {
                      iVar31 = iVar37;
                    }
                    for (; iVar37 != iVar31; iVar37 = iVar37 + 1) {
                      auVar53 = *pauVar29;
                      iVar38 = iVar20;
                      while (bVar49 = iVar38 != 0, iVar38 = iVar38 + -1, bVar49) {
                        *pauVar43 = auVar53;
                        pauVar43 = pauVar43 + 1;
                      }
                      lVar46 = 0;
                      for (iVar38 = 0; iVar38 < m_1.w; iVar38 = iVar38 + 1) {
                        auVar53 = *(undefined1 (*) [32])(*pauVar29 + lVar46);
                        *(undefined1 (*) [32])(*pauVar43 + lVar46) = auVar53;
                        lVar46 = lVar46 + 0x20;
                      }
                      pauVar43 = (undefined1 (*) [32])(*pauVar43 + lVar46);
                      iVar38 = iVar28;
                      while (bVar49 = iVar38 != 0, iVar38 = iVar38 + -1, bVar49) {
                        *pauVar43 = auVar53;
                        pauVar43 = pauVar43 + 1;
                      }
                    }
                    p_Var36 = pp_Var23[-3];
                    iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var36);
                  }
                  lVar46 = -0x40;
                  if (iVar20 == 2) {
                    iVar20 = *(int *)(&this->field_0xd0 + (long)p_Var36);
                    uVar24 = *(uint *)(&this->field_0xd8 + (long)p_Var36);
                    pauVar43 = (undefined1 (*) [32])
                               ((long)(m_1.w * iVar20 * 8) * 4 + (long)m_1.data);
                    uVar34 = 0;
                    uVar25 = 0;
                    if (0 < (int)uVar24) {
                      uVar25 = (ulong)uVar24;
                    }
                    uVar32 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var36);
                    if ((int)*(uint *)(&this->field_0xdc + (long)p_Var36) < 1) {
                      uVar32 = uVar34;
                    }
                    iVar37 = *(int *)(&this->field_0xd4 + (long)p_Var36);
                    if (iVar20 < 1) {
                      iVar20 = 0;
                    }
                    lVar26 = uVar25 * 0x20;
                    lVar33 = uVar32 * 0x20;
                    pauVar29 = (undefined1 (*) [32])m.data;
                    for (; (int)uVar34 != iVar20; uVar34 = (ulong)((int)uVar34 + 1)) {
                      lVar47 = 0;
                      for (lVar45 = 0; lVar26 + lVar45 != 0; lVar45 = lVar45 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar29 + lVar47) =
                             *(undefined1 (*) [32])(pauVar43[(int)uVar24] + lVar45);
                        lVar47 = lVar47 + 0x20;
                      }
                      pauVar29 = (undefined1 (*) [32])((long)pauVar29 - lVar45);
                      pauVar40 = pauVar43;
                      for (iVar28 = 0; lVar45 = lVar46, iVar28 < m_1.w; iVar28 = iVar28 + 1) {
                        *pauVar29 = *pauVar40;
                        pauVar40 = pauVar40 + 1;
                        pauVar29 = pauVar29 + 1;
                      }
                      for (; lVar33 + lVar45 != -0x40; lVar45 = lVar45 + -0x20) {
                        *pauVar29 = *(undefined1 (*) [32])(*pauVar40 + lVar45);
                        pauVar29 = pauVar29 + 1;
                      }
                      pauVar43 = pauVar43 + -(long)m_1.w;
                    }
                    for (iVar20 = 0; iVar20 < m_1.h; iVar20 = iVar20 + 1) {
                      lVar47 = 0;
                      for (lVar45 = 0; lVar26 + lVar45 != 0; lVar45 = lVar45 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar29 + lVar47) =
                             *(undefined1 (*) [32])(pauVar43[(int)uVar24] + lVar45);
                        lVar47 = lVar47 + 0x20;
                      }
                      pauVar29 = (undefined1 (*) [32])((long)pauVar29 - lVar45);
                      for (iVar28 = 0; lVar45 = lVar46, iVar28 < m_1.w; iVar28 = iVar28 + 1) {
                        *pauVar29 = *pauVar43;
                        pauVar43 = pauVar43 + 1;
                        pauVar29 = pauVar29 + 1;
                      }
                      for (; lVar33 + lVar45 != -0x40; lVar45 = lVar45 + -0x20) {
                        *pauVar29 = *(undefined1 (*) [32])(*pauVar43 + lVar45);
                        pauVar29 = pauVar29 + 1;
                      }
                    }
                    pauVar43 = pauVar43 + (long)m_1.w * -2;
                    iVar20 = 0;
                    if (iVar37 < 1) {
                      iVar37 = iVar20;
                    }
                    for (; iVar20 != iVar37; iVar20 = iVar20 + 1) {
                      lVar47 = 0;
                      for (lVar45 = 0; lVar26 + lVar45 != 0; lVar45 = lVar45 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar29 + lVar47) =
                             *(undefined1 (*) [32])(pauVar43[(int)uVar24] + lVar45);
                        lVar47 = lVar47 + 0x20;
                      }
                      pauVar29 = (undefined1 (*) [32])((long)pauVar29 - lVar45);
                      pauVar40 = pauVar43;
                      for (iVar28 = 0; lVar45 = lVar46, iVar28 < m_1.w; iVar28 = iVar28 + 1) {
                        *pauVar29 = *pauVar40;
                        pauVar40 = pauVar40 + 1;
                        pauVar29 = pauVar29 + 1;
                      }
                      for (; lVar33 + lVar45 != -0x40; lVar45 = lVar45 + -0x20) {
                        *pauVar29 = *(undefined1 (*) [32])(*pauVar40 + lVar45);
                        pauVar29 = pauVar29 + 1;
                      }
                      pauVar43 = pauVar43 + -(long)m_1.w;
                    }
                  }
                  pPVar55 = this;
                  if (m_1.refcount != (int *)0x0) {
                    LOCK();
                    *m_1.refcount = *m_1.refcount + -1;
                    UNLOCK();
                    if (*m_1.refcount == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (m.refcount != (int *)0x0) {
                    LOCK();
                    *m.refcount = *m.refcount + -1;
                    UNLOCK();
                    if (*m.refcount == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        free(m.data);
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar27 = (ulong)((int)uVar27 + 1);
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        m.dims = 4;
        if (*(int *)(&this->field_0xe0 + (long)p_Var36) == 0) {
          uVar42 = *(int *)(&this->field_0xe8 + (long)p_Var36) + iVar20 +
                   *(int *)(&this->field_0xec + (long)p_Var36);
          pMVar57 = top_blob;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var36) +
                               *(int *)(&this->field_0xdc + (long)p_Var36),
                      uVar24 + m.h + *(int *)(&this->field_0xd4 + (long)p_Var36),uVar42,iVar54,
                      m.elemsize,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar57->c * pMVar57->cstep != 0) {
            if ((int)uVar42 < 1) {
              uVar42 = 0;
            }
            if (iVar54 < 1) {
              iVar54 = 0;
            }
            fVar58 = 0.0;
            pPVar55 = this;
            for (lVar46 = 0; lVar46 != CONCAT44(fVar58,iVar54); lVar46 = lVar46 + 1) {
              p_Var36 = this->_vptr_Padding_x86_fma[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var36) == 0) {
                uVar59 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var36);
                auVar53._4_4_ = uVar59;
                auVar53._0_4_ = uVar59;
                auVar53._8_4_ = uVar59;
                auVar53._12_4_ = uVar59;
                auVar53._16_4_ = uVar59;
                auVar53._20_4_ = uVar59;
                auVar53._24_4_ = uVar59;
                auVar53._28_4_ = uVar59;
              }
              else {
                auVar53 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var36) + lVar46 * 0x20);
              }
              for (uVar48 = 0; uVar48 != uVar42; uVar48 = uVar48 + 1) {
                m.w = pMVar57->w;
                m.h = pMVar57->h;
                m.elemsize = pMVar57->elemsize;
                m.elempack = pMVar57->elempack;
                m.allocator = pMVar57->allocator;
                m.cstep = (long)m.h * (long)m.w;
                m.data = (void *)((long)pMVar57->data +
                                 uVar48 * m.elemsize * m.cstep +
                                 pMVar57->cstep * lVar46 * m.elemsize);
                m.refcount = (int *)0x0;
                m.dims = 2;
                m.d = 1;
                m.c = 1;
                p_Var36 = this->_vptr_Padding_x86_fma[-3];
                uVar24 = (int)uVar48 - *(int *)(&this->field_0xe8 + (long)p_Var36);
                if ((int)uVar24 < 0 || iVar20 <= (int)uVar24) {
                  uVar21 = m.cstep & 0xffffffff;
                  if ((int)m.cstep < 1) {
                    uVar21 = 0;
                  }
                  while (iVar37 = (int)uVar21, uVar21 = (ulong)(iVar37 - 1), iVar37 != 0) {
                    *(undefined1 (*) [32])m.data = auVar53;
                    m.data = (void *)((long)m.data + 0x20);
                  }
                }
                else {
                  m_1.h = bottom_blob->h;
                  m_1.elemsize = bottom_blob->elemsize;
                  m_1.allocator = bottom_blob->allocator;
                  m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                  m_1.data = (void *)((long)bottom_blob->data +
                                     m_1.cstep * m_1.elemsize * (ulong)uVar24 +
                                     bottom_blob->cstep * lVar46 * m_1.elemsize);
                  m_1.refcount = (int *)0x0;
                  m_1.elempack = bottom_blob->elempack;
                  m_1.w = bottom_blob->w;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  v_01._8_8_ = pMVar57;
                  v_01._0_8_ = pPVar55;
                  v_01._16_8_ = bottom_blob;
                  v_01[6] = (float)iVar54;
                  v_01[7] = fVar58;
                  pPVar56 = pPVar55;
                  padding_constant_pack8_avx
                            (&m_1,&m,*(int *)(&pPVar55->field_0xd0 + (long)p_Var36),
                             *(int *)(&pPVar55->field_0xd4 + (long)p_Var36),
                             *(int *)(&pPVar55->field_0xd8 + (long)p_Var36),
                             *(int *)(&pPVar55->field_0xdc + (long)p_Var36),v_01);
                  this = pPVar55;
                  pPVar55 = pPVar56;
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
  }
  piVar2 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.c = iVar54;
  m.d = iVar20;
  m.cstep = bottom_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar5 = opt->flush_denormals;
    uVar6 = opt->use_local_pool_allocator;
    uVar8 = opt->use_shader_local_memory;
    uVar10 = opt->use_cooperative_matrix;
    uVar12 = opt->use_winograd23_convolution;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    uVar13._0_1_ = opt->use_winograd43_convolution;
    uVar13._1_1_ = opt->use_winograd63_convolution;
    uVar13._2_1_ = opt->use_reserved_6;
    uVar13._3_1_ = opt->use_reserved_7;
    uVar14 = opt->use_reserved_8;
    uVar15 = opt->use_reserved_9;
    uVar17 = opt->use_reserved_10;
    uVar19 = opt->use_reserved_11;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar13._4_4_ = CONCAT31(uVar16,uVar14);
    m_1.c = (int)uVar13;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar5;
    m_1.d = uVar7;
    m_1._60_4_ = uVar13._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar20 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86_fma +
                            (long)this->_vptr_Padding_x86_fma[-3]),&m,top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int Padding_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}